

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O3

bool __thiscall Clasp::SharedContext::attach(SharedContext *this,Solver *other)

{
  uint32 *puVar1;
  uint32 numConsGuess;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  SolverParams *params;
  undefined4 extraout_var;
  ulong uVar9;
  Solver *pSVar10;
  long *plVar11;
  uint uVar12;
  ulong uVar13;
  Literal x;
  Antecedent null;
  Literal local_3c;
  Antecedent local_38;
  Constraint *pCVar8;
  
  if ((this->step_).rep_ >> 2 <= (other->assign_).assign_.ebo_.size - 1) {
    bVar5 = Solver::popRootLevel(other,(other->levels_).root,(LitVec *)0x0,true);
    if (!bVar5) {
      return false;
    }
    if (*(this->solvers_).ebo_.buf == other) {
      return true;
    }
  }
  initStats(this,other);
  uVar12 = (other->assign_).assign_.ebo_.size;
  numConsGuess = ((*(this->solvers_).ebo_.buf)->constraints_).ebo_.size;
  plVar11 = (long *)((this->config_).ptr_ & 0xfffffffffffffffe);
  params = (SolverParams *)(**(code **)(*plVar11 + 0x30))(plVar11,(ulong)other->strategy_ >> 0x3a);
  Solver::startInit(other,numConsGuess,params);
  if ((other->conflict_).ebo_.size == 0) {
    local_38.data_ = 0;
    pSVar10 = *(this->solvers_).ebo_.buf;
    uVar9 = (ulong)(pSVar10->assign_).trail.ebo_.size;
    if (uVar9 != 0) {
      uVar13 = 0;
      do {
        pSVar10 = *(this->solvers_).ebo_.buf;
        local_3c.rep_ = (pSVar10->assign_).trail.ebo_.buf[uVar13].rep_;
        if ((local_3c.rep_ >> 2 <= (pSVar10->shared_->varInfo_).ebo_.size - 1) &&
           (bVar5 = Solver::force(other,&local_3c,&local_38), !bVar5)) {
          return false;
        }
        uVar13 = uVar13 + 1;
      } while (uVar9 != uVar13);
      pSVar10 = *(this->solvers_).ebo_.buf;
    }
    if ((this->satPrepro).ptr_ < 2) {
      uVar12 = 0x40000000;
    }
    uVar6 = (pSVar10->assign_).assign_.ebo_.size - 1;
    if (uVar12 <= uVar6) {
      puVar3 = (pSVar10->assign_).assign_.ebo_.buf;
      puVar4 = (other->assign_).assign_.ebo_.buf;
      do {
        if ((0xffffffef < puVar3[uVar12]) &&
           (uVar2 = puVar4[uVar12], uVar2 < 0xfffffff0 && (uVar2 & 3) == 0)) {
          puVar4[uVar12] = 0xfffffff1;
          puVar1 = &(other->assign_).elims_;
          *puVar1 = *puVar1 + 1;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 <= uVar6);
    }
    if ((other->constraints_).ebo_.size == 0) {
      *(uint *)&other->field_0x204 =
           *(uint *)&other->field_0x204 & 0xc0000000 | *(uint *)&pSVar10->field_0x204 & 0x3fffffff;
      pSVar10 = *(this->solvers_).ebo_.buf;
    }
    bVar5 = Solver::cloneDB(other,&pSVar10->constraints_);
    if (bVar5) {
      pCVar8 = (*(this->solvers_).ebo_.buf)->enum_;
      if (pCVar8 == (Constraint *)0x0) {
        pCVar8 = (Constraint *)0x0;
      }
      else {
        iVar7 = (*pCVar8->_vptr_Constraint[2])(pCVar8,other);
        pCVar8 = (Constraint *)CONCAT44(extraout_var,iVar7);
      }
      Solver::setEnumerationConstraint(other,pCVar8);
      bVar5 = Solver::preparePost(other);
      if ((bVar5) && (bVar5 = Solver::endInit(other), bVar5)) {
        return true;
      }
      Solver::setEnumerationConstraint(other,(Constraint *)0x0);
      Solver::popAuxVar(other,0xffffffff,(ConstraintDB *)0x0);
      return false;
    }
  }
  return false;
}

Assistant:

bool SharedContext::attach(Solver& other) {
	assert(frozen() && other.shared_ == this);
	if (other.validVar(step_.var())) {
		if (!other.popRootLevel(other.rootLevel())){ return false; }
		if (&other == master())                    { return true;  }
	}
	initStats(other);
	// 1. clone vars & assignment
	Var lastVar = other.numVars();
	other.startInit(static_cast<uint32>(master()->constraints_.size()), configuration()->solver(other.id()));
	if (other.hasConflict()) { return false; }
	Antecedent null;
	for (LitVec::size_type i = 0, end = master()->trail().size(); i != end; ++i) {
		Literal x = master()->trail()[i];
		if (master()->auxVar(x.var())) { continue;  }
		if (!other.force(x, null))     { return false; }
	}
	for (Var v = satPrepro.get() ? lastVar+1 : varMax, end = master()->numVars(); v <= end; ++v) {
		if (eliminated(v) && other.value(v) == value_free) {
			other.assign_.eliminate(v);
		}
	}
	if (other.constraints_.empty()) { other.lastSimp_ = master()->lastSimp_; }
	// 2. clone & attach constraints
	if (!other.cloneDB(master()->constraints_)) { return false; }
	Constraint* c = master()->enumerationConstraint();
	other.setEnumerationConstraint( c ? c->cloneAttach(other) : 0 );
	// 3. endInit
	return (other.preparePost() && other.endInit()) || (detach(other, false), false);
}